

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.cpp
# Opt level: O2

void __thiscall Chip8::CPU::reset(CPU *this)

{
  long lVar1;
  
  this->_index_register = 0;
  this->_program_counter = 0x200;
  this->_stack_pointer = 0;
  this->_delay_timer = '\0';
  this->_sound_timer = '\0';
  for (lVar1 = 0; lVar1 != 0x10; lVar1 = lVar1 + 1) {
    this->_registers[lVar1] = '\0';
  }
  return;
}

Assistant:

void CPU::reset() {
        _program_counter = 0x200;
        _delay_timer = 0;
        _sound_timer = 0;
        _stack_pointer = 0;
        _index_register = 0;

        std::fill_n(_registers, sizeof(_registers), 0);
    }